

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Iterator<TestType,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
          (Iterator<TestType,_true,_std::allocator<unsigned_long>_> *this)

{
  View<TestType,_true,_std::allocator<unsigned_long>_> *pVVar1;
  ulong uVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer puVar5;
  size_t sVar6;
  size_t sVar7;
  reference pTVar8;
  runtime_error *this_00;
  size_t dimension;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<TestType,_true,_std::allocator<unsigned_long>_> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0022db9d:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->index_ < (pVVar1->geometry_).size_) {
    this->index_ = this->index_ + 1;
    View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
    if ((pVVar1->geometry_).isSimple_ == true) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      pVVar1 = this->view_;
      uVar2 = (pVVar1->geometry_).size_;
      if (this->index_ < uVar2) {
        View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        puVar5 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          if (puVar3 != puVar5) {
            dimension = 0;
            do {
              uVar4 = puVar5[dimension];
              sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::shape
                                (this->view_,dimension);
              sVar7 = View<TestType,_true,_std::allocator<unsigned_long>_>::strides
                                (this->view_,dimension);
              if (uVar4 != sVar6 - 1) goto LAB_0022db6c;
              puVar5 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              this->pointer_ = this->pointer_ + -(sVar7 * puVar5[dimension]);
              puVar5[dimension] = 0;
              dimension = dimension + 1;
              puVar5 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (dimension <
                     (ulong)((long)(this->coordinates_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3));
          }
        }
        else {
          dimension = (long)puVar3 - (long)puVar5 >> 3;
          do {
            dimension = dimension - 1;
            uVar4 = (this->coordinates_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[dimension];
            sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::shape
                              (this->view_,dimension);
            sVar7 = View<TestType,_true,_std::allocator<unsigned_long>_>::strides
                              (this->view_,dimension);
            if (uVar4 != sVar6 - 1) goto LAB_0022db6c;
            puVar5 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar7 * puVar5[dimension]);
            puVar5[dimension] = 0;
          } while (dimension != 0);
        }
      }
      else {
        pTVar8 = View<TestType,_true,_std::allocator<unsigned_long>_>::operator()(pVVar1,uVar2 - 1);
        this->pointer_ = pTVar8 + 1;
        pVVar1 = this->view_;
        View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          puVar5 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar5 = *puVar5 + 1;
        }
        else {
          if (this->view_->data_ == (pointer)0x0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0022db9d;
          }
          puVar5 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + ((this->view_->geometry_).dimension_ - 1);
          *puVar5 = *puVar5 + 1;
        }
      }
    }
  }
  goto LAB_0022da20;
LAB_0022db6c:
  this->pointer_ = this->pointer_ + sVar7;
  puVar5 = (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + dimension;
  *puVar5 = *puVar5 + 1;
LAB_0022da20:
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}